

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>
               (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
                *source)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
  *source_00;
  GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>
  *source_01;
  vector<int,_std::allocator<int>_> *source_02;
  vector<int,_std::allocator<int>_> *source_03;
  vector<int,_std::allocator<int>_> *source_04;
  vector<int,_std::allocator<int>_> *source_05;
  vector<int,_std::allocator<int>_> *source_06;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  initializer_list<int> __l_03;
  anon_class_1_0_00000001 local_172;
  allocator_type local_171;
  vector<int,_std::allocator<int>_> local_170;
  undefined1 local_158 [16];
  undefined **local_148;
  IState<int> local_140;
  undefined **local_138;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  iterator local_128;
  undefined **local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  undefined1 local_110 [16];
  element_type *local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  IState<int> local_f0;
  iterator local_e8;
  iterator local_e0;
  undefined1 local_d8 [16];
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_c8;
  undefined1 local_98 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  IState<int> local_80;
  iterator local_70;
  undefined **local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  int local_48 [6];
  
  iVar2 = linq::
          Min<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::Min()::_lambda(auto:1_const&)_1_>
                    (&source->source,(anon_class_1_0_00000001 *)local_158);
  assertEquals<int,int>(3,iVar2);
  iVar2 = linq::
          Max<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::Max()::_lambda(auto:1_const&)_1_>
                    (&source->source,(anon_class_1_0_00000001 *)local_158);
  assertEquals<int,int>(10,iVar2);
  sVar4 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
          Count(source);
  assertEquals<int,unsigned_long>(8,sVar4);
  iVar2 = linq::
          Sum<linq::IEnumerable<int>,linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::Sum()::_lambda(auto:1_const&)_1_>
                    (&(source->source).source1,(anon_class_1_0_00000001 *)local_158);
  iVar3 = linq::
          Sum<linq::IEnumerable<int>,linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::Sum()::_lambda(auto:1_const&)_1_>
                    (&(source->source).source2,(anon_class_1_0_00000001 *)local_158);
  assertEquals<int,int>(0x34,iVar2 + iVar3);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
  Take((IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
        *)local_158,source,3);
  iVar2 = linq::
          Min<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>,linq::IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>>::Min()::_lambda(auto:1_const&)_1_>
                    ((TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>
                      *)local_158,(anon_class_1_0_00000001 *)local_98);
  assertEquals<int,int>(3,iVar2);
  local_158._0_8_ = &PTR_Init_00157978;
  local_158._8_8_ = &PTR_Init_001571a0;
  local_128._M_current = (int *)&PTR_Init_00156bc0;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  local_140._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
  Take((IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
        *)local_158,source,3);
  iVar2 = linq::
          Max<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>,linq::IEnumerableCore<linq::TakeState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>>::Max()::_lambda(auto:1_const&)_1_>
                    ((TakeState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>
                      *)local_158,(anon_class_1_0_00000001 *)local_98);
  assertEquals<int,int>(5,iVar2);
  local_158._0_8_ = &PTR_Init_00157978;
  local_158._8_8_ = &PTR_Init_001571a0;
  local_128._M_current = (int *)&PTR_Init_00156bc0;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  local_140._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
  Skip((IEnumerableCore<linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
        *)local_158,source,3);
  iVar2 = linq::
          Min<linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>,linq::IEnumerableCore<linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>>::Min()::_lambda(auto:1_const&)_1_>
                    ((SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>
                      *)local_158,(anon_class_1_0_00000001 *)local_98);
  assertEquals<int,int>(6,iVar2);
  local_158._0_8_ = &PTR_Init_001579c0;
  local_158._8_8_ = &PTR_Init_001571a0;
  local_128._M_current = (int *)&PTR_Init_00156bc0;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  local_140._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
  Skip((IEnumerableCore<linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>_>
        *)local_158,source,3);
  iVar2 = linq::
          Max<linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>,linq::IEnumerableCore<linq::SkipState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>>::Max()::_lambda(auto:1_const&)_1_>
                    ((SkipState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_int>
                      *)local_158,(anon_class_1_0_00000001 *)local_98);
  assertEquals<int,int>(10,iVar2);
  local_158._0_8_ = &PTR_Init_001579c0;
  local_158._8_8_ = &PTR_Init_001571a0;
  local_128._M_current = (int *)&PTR_Init_00156bc0;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  local_140._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  TakeWhile<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_1_>
            ((IEnumerableCore<linq::TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>_>
              *)local_158,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,(anon_class_1_0_00000001_for_filter *)&local_170);
  iVar2 = linq::
          Min<linq::TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_1_,int>,linq::IEnumerableCore<linq::TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_1_,int>>::Min()::_lambda(auto:1_const&)_1_>
                    ((TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:17:39),_int>
                      *)local_158,(anon_class_1_0_00000001 *)local_98);
  assertEquals<int,int>(3,iVar2);
  local_158._0_8_ = &PTR_Init_00157a08;
  local_158._8_8_ = &PTR_Init_001571a0;
  local_128._M_current = (int *)&PTR_Init_00156bc0;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  local_140._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  TakeWhile<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_2_>
            ((IEnumerableCore<linq::TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>_>
              *)local_158,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,(anon_class_1_0_00000001_for_filter *)&local_170);
  iVar2 = linq::
          Max<linq::TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_2_,int>,linq::IEnumerableCore<linq::TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_2_,int>>::Max()::_lambda(auto:1_const&)_1_>
                    ((TakeWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:18:39),_int>
                      *)local_158,(anon_class_1_0_00000001 *)local_98);
  assertEquals<int,int>(4,iVar2);
  local_158._0_8_ = &PTR_Init_00157a50;
  local_158._8_8_ = &PTR_Init_001571a0;
  local_128._M_current = (int *)&PTR_Init_00156bc0;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  local_140._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  SkipWhile<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_3_>
            ((IEnumerableCore<linq::SkipWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:19:39),_int>_>
              *)local_158,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,(anon_class_1_0_00000001_for_filter *)&local_170);
  iVar2 = linq::
          Min<linq::SkipWhileState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_3_,int>,linq::IEnumerableCore<linq::SkipWhileState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_3_,int>>::Min()::_lambda(auto:1_const&)_1_>
                    ((SkipWhileState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:19:39),_int>
                      *)local_158,(anon_class_1_0_00000001 *)local_98);
  assertEquals<int,int>(5,iVar2);
  local_158._0_8_ = &PTR_Init_00157a98;
  local_158._8_8_ = &PTR_Init_001571a0;
  local_128._M_current = (int *)&PTR_Init_00156bc0;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  local_140._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Where<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_4_>
            ((IEnumerableCore<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:20:35),_int>_>
              *)local_158,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,(anon_class_1_0_00000001_for_filter *)local_98);
  sVar4 = linq::
          IEnumerableCore<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:20:35),_int>_>
          ::Count((IEnumerableCore<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:20:35),_int>_>
                   *)local_158);
  assertEquals<int,unsigned_long>(4,sVar4);
  local_158._0_8_ = &PTR_Init_00157ae0;
  local_158._8_8_ = &PTR_Init_001571a0;
  local_128._M_current = (int *)&PTR_Init_00156bc0;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  local_140._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Where<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_5_>
            ((IEnumerableCore<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>_>
              *)local_98,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,(anon_class_1_0_00000001_for_filter *)&local_170);
  linq::
  IEnumerableCore<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:21:35),_int>_>
  ::Skip((IEnumerableCore<linq::SkipState<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>,_int>_>
          *)local_158,
         (IEnumerableCore<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>_>
          *)local_98,1);
  iVar2 = linq::
          First<linq::SkipState<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_5_,int>,int>>
                    ((SkipState<linq::WhereState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:21:35),_int>,_int>
                      *)local_158);
  assertEquals<int,int>(6,iVar2);
  local_158._0_8_ = &PTR_Init_00157b70;
  local_158._8_8_ = &PTR_Init_00157b28;
  local_148 = &PTR_Init_001571a0;
  local_120 = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_);
  }
  local_138 = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current);
  }
  local_98._0_8_ = &PTR_Init_00157b28;
  local_98._8_8_ = &PTR_Init_001571a0;
  local_68 = &PTR_Init_00156bc0;
  if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
  }
  local_80._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._M_current);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  GroupBy<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_6_>
            ((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
              *)local_158,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,(anon_class_1_0_00000001 *)local_98);
  sVar4 = linq::
          IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
          ::Count((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
                   *)local_158);
  assertEquals<int,unsigned_long>(2,sVar4);
  local_158._0_8_ = &PTR_Init_00157bc8;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&local_f0);
  if (local_100 != (element_type *)0x0) {
    (*(code *)local_100)(local_110,local_110,3);
  }
  local_158._8_8_ = &PTR_Init_001571a0;
  local_128._M_current = (int *)&PTR_Init_00156bc0;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  local_140._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  GroupBy<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_7_>
            ((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
              *)local_158,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,(anon_class_1_0_00000001 *)&local_170);
  linq::
  First<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>,bool,int>>
            ((OUT *)local_98,(linq *)local_158,source_00);
  sVar4 = linq::IEnumerable<int_&>::Count((IEnumerable<int_&> *)local_98);
  assertEquals<int,unsigned_long>(6,sVar4);
  local_98._0_8_ = &PTR_Init_00157638;
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  local_158._0_8_ = &PTR_Init_00157bc8;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&local_f0);
  if (local_100 != (element_type *)0x0) {
    (*(code *)local_100)(local_110,local_110,3);
  }
  local_158._8_8_ = &PTR_Init_001571a0;
  local_128._M_current = (int *)&PTR_Init_00156bc0;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  local_140._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  GroupBy<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_8_>
            ((IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_bool,_int>_>
              *)local_158,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,(anon_class_1_0_00000001 *)&local_170);
  linq::
  Last<linq::GroupByState<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>,bool,int>>
            ((OUT *)local_98,(linq *)local_158,source_01);
  sVar4 = linq::IEnumerable<int_&>::Count((IEnumerable<int_&> *)local_98);
  assertEquals<int,unsigned_long>(2,sVar4);
  local_98._0_8_ = &PTR_Init_00157638;
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  local_158._0_8_ = &PTR_Init_00157bc8;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
               *)&local_f0);
  if (local_100 != (element_type *)0x0) {
    (*(code *)local_100)(local_110,local_110,3);
  }
  local_158._8_8_ = &PTR_Init_001571a0;
  local_128._M_current = (int *)&PTR_Init_00156bc0;
  if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
  }
  local_140._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
  }
  iVar2 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
          Single<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_9_>
                    ((IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
                      *)source,(anon_class_1_0_00000001_for_filter *)local_158);
  assertEquals<int,int>(5,iVar2);
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l._M_len = 5;
  __l._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_170,__l,&local_171);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )local_98,(linq *)&local_170,source_02);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>
            ((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_158,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             local_98,source);
  iVar2 = linq::
          Min<linq::IntersectState<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>,linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>,linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::Intersect<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&)::_lambda(int)_1_,int>,linq::IEnumerableCore<linq::IntersectState<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>,linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>,linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::Intersect<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&)::_lambda(int)_1_,int>>::Min()::_lambda(auto:1_const&)_1_>
                    ((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
                      *)local_158,&local_172);
  assertEquals<int,int>(5,iVar2);
  local_158._0_8_ = &PTR_Init_00157c78;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_d8);
  local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_001571a0;
  local_f0._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if ((_Base_ptr)local_e0._M_current != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_current);
  }
  local_110._8_8_ = &PTR_Init_00156bc0;
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
  }
  local_148 = &PTR_Init_00157230;
  if (local_140._vptr_IState != (_func_int **)0x0) {
    operator_delete(local_140._vptr_IState,(long)local_130._M_pi - (long)local_140._vptr_IState);
  }
  local_98._0_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_98._8_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_98._8_8_,(long)local_80._vptr_IState - local_98._8_8_);
  }
  if (local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l_00._M_len = 5;
  __l_00._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_170,__l_00,&local_171);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )local_98,(linq *)&local_170,source_03);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>
            ((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_158,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             local_98,source);
  iVar2 = linq::
          Max<linq::IntersectState<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>,linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>,linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::Intersect<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&)::_lambda(int)_1_,int>,linq::IEnumerableCore<linq::IntersectState<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>,linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>,linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::Intersect<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&)::_lambda(int)_1_,int>>::Max()::_lambda(auto:1_const&)_1_>
                    ((IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>
                      *)local_158,(anon_class_1_0_00000001 *)&local_172);
  assertEquals<int,int>(7,iVar2);
  local_158._0_8_ = &PTR_Init_00157c78;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_d8);
  local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_001571a0;
  local_f0._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if ((_Base_ptr)local_e0._M_current != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_current);
  }
  local_110._8_8_ = &PTR_Init_00156bc0;
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
  }
  local_148 = &PTR_Init_00157230;
  if (local_140._vptr_IState != (_func_int **)0x0) {
    operator_delete(local_140._vptr_IState,(long)local_130._M_pi - (long)local_140._vptr_IState);
  }
  local_98._0_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_98._8_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_98._8_8_,(long)local_80._vptr_IState - local_98._8_8_);
  }
  if (local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l_01._M_len = 5;
  __l_01._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_170,__l_01,(allocator_type *)&local_172);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )local_98,(linq *)&local_170,source_04);
  linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>::
  Intersect<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>
            ((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_158,
             (IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>> *)
             local_98,source);
  sVar4 = linq::
          IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count((IEnumerableCore<linq::IntersectState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
                   *)local_158);
  assertEquals<int,unsigned_long>(3,sVar4);
  local_158._0_8_ = &PTR_Init_00157c78;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_d8);
  local_118._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_001571a0;
  local_f0._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  if ((_Base_ptr)local_e0._M_current != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._M_current);
  }
  local_110._8_8_ = &PTR_Init_00156bc0;
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
  }
  local_148 = &PTR_Init_00157230;
  if (local_140._vptr_IState != (_func_int **)0x0) {
    operator_delete(local_140._vptr_IState,(long)local_130._M_pi - (long)local_140._vptr_IState);
  }
  local_98._0_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_98._8_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_98._8_8_,(long)local_80._vptr_IState - local_98._8_8_);
  }
  if (local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l_02._M_len = 5;
  __l_02._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_170,__l_02,(allocator_type *)&local_172);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )local_98,(linq *)&local_170,source_05);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Intersect<linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>>
            ((IEnumerableCore<linq::IntersectState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_158,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,
             (IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )local_98);
  sVar4 = linq::
          IEnumerableCore<linq::IntersectState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count((IEnumerableCore<linq::IntersectState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
                   *)local_158);
  assertEquals<int,unsigned_long>(3,sVar4);
  local_158._0_8_ = &PTR_Init_00157cc0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_d8);
  local_110._8_8_ = &PTR_Init_00157230;
  if (local_100 != (element_type *)0x0) {
    operator_delete(local_100,(long)local_f0._vptr_IState - (long)local_100);
  }
  local_148 = &PTR_Init_001571a0;
  local_120 = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_);
  }
  local_138 = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current);
  }
  local_98._0_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_98._8_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_98._8_8_,(long)local_80._vptr_IState - local_98._8_8_);
  }
  if (local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_48[0] = 1;
  local_48[1] = 5;
  local_48[2] = 6;
  local_48[3] = 7;
  local_48[4] = 5;
  __l_03._M_len = 5;
  __l_03._M_array = local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_170,__l_03,(allocator_type *)&local_172);
  linq::Adapt<std::vector<int,std::allocator<int>>,void>
            ((IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )local_98,(linq *)&local_170,source_06);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Except<linq::IEnumerableCore<linq::AdapterState<int&,std::vector<int,std::allocator<int>>>>>
            ((IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
              *)local_158,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,
             (IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *
             )local_98);
  sVar4 = linq::
          IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count((IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
                   *)local_158);
  assertEquals<int,unsigned_long>(5,sVar4);
  local_158._0_8_ = &PTR_Init_00157d08;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_d8);
  local_110._8_8_ = &PTR_Init_00157230;
  if (local_100 != (element_type *)0x0) {
    operator_delete(local_100,(long)local_f0._vptr_IState - (long)local_100);
  }
  local_148 = &PTR_Init_001571a0;
  local_120 = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_);
  }
  local_138 = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current);
  }
  local_98._0_8_ = &PTR_Init_00157230;
  if ((_func_int **)local_98._8_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_98._8_8_,(long)local_80._vptr_IState - local_98._8_8_);
  }
  if (local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_170.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_98._8_8_ = operator_new(0x18);
  ((IState<int> *)local_98._8_8_)->_vptr_IState = (_func_int **)&PTR_Init_001572d0;
  ((IState<int> *)(local_98._8_8_ + 8))->_vptr_IState = (_func_int **)0x900000005;
  local_98._0_8_ = &PTR_Init_00156bc0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<linq::IState<int>*>
            (&local_88,(IState<int> *)local_98._8_8_);
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Except<linq::IEnumerable<int>>
            ((IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
              *)local_158,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,(IEnumerable<int> *)local_98);
  sVar4 = linq::
          IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count((IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
                   *)local_158);
  assertEquals<int,unsigned_long>(3,sVar4);
  local_158._0_8_ = &PTR_Init_00157d50;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             &local_f0);
  local_110._8_8_ = &PTR_Init_00156bc0;
  if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
  }
  local_148 = &PTR_Init_001571a0;
  local_120 = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_);
  }
  local_138 = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current);
  }
  local_98._0_8_ = &PTR_Init_00156bc0;
  if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Intersect<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>
            ((IEnumerableCore<linq::IntersectState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
              *)local_158,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,source);
  sVar4 = linq::
          IEnumerableCore<linq::IntersectState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:120:13),_int>_>
          ::Count((IEnumerableCore<linq::IntersectState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:120:13),_int>_>
                   *)local_158);
  assertEquals<int,unsigned_long>(8,sVar4);
  local_158._0_8_ = &PTR_Init_00157d98;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_c8);
  local_110._8_8_ = &PTR_Init_001571a0;
  local_e0._M_current = (int *)&PTR_Init_00156bc0;
  if ((_Base_ptr)local_d8._8_8_ != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_current);
  }
  local_148 = &PTR_Init_001571a0;
  local_120 = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_);
  }
  local_138 = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current);
  }
  linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
  Except<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>&>
            ((IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
              *)local_158,
             (IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
              *)source,source);
  sVar4 = linq::
          IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/../src/IEnumerableCore.hpp:137:13),_int>_>
          ::Count((IEnumerableCore<linq::ExceptState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests____src_IEnumerableCore_hpp:137:13),_int>_>
                   *)local_158);
  assertEquals<int,unsigned_long>(0,sVar4);
  local_158._0_8_ = &PTR_Init_00157de0;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_c8);
  local_110._8_8_ = &PTR_Init_001571a0;
  local_e0._M_current = (int *)&PTR_Init_00156bc0;
  if ((_Base_ptr)local_d8._8_8_ != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._8_8_);
  }
  local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._M_current);
  }
  local_148 = &PTR_Init_001571a0;
  local_120 = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_110._0_8_);
  }
  local_138 = &PTR_Init_00156bc0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_current);
  }
  bVar1 = linq::Any<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
                    (&source->source);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
          Any<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_10_>
                    ((IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
                      *)source,(anon_class_1_0_00000001_for_filter *)local_158);
  assertEquals<bool,bool>(true,bVar1);
  bVar1 = linq::
          All<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_11_>
                    (&source->source,(anon_class_1_0_00000001 *)local_158);
  assertEquals<bool,bool>(false,bVar1);
  bVar1 = linq::
          IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>::
          Any<test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_12_>
                    ((IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>
                      *)source,(anon_class_1_0_00000001_for_filter *)local_158);
  assertEquals<bool,bool>(false,bVar1);
  bVar1 = linq::
          All<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,test<linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>>(linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>>)::_lambda(int)_13_>
                    (&source->source,(anon_class_1_0_00000001 *)local_158);
  assertEquals<bool,bool>(true,bVar1);
  local_158._0_4_ = 6;
  bVar1 = linq::Contains<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>
                    (&source->source,(int *)local_158);
  assertEquals<bool,bool>(true,bVar1);
  local_158._0_4_ = 0x10;
  bVar1 = linq::Contains<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>
                    (&source->source,(int *)local_158);
  assertEquals<bool,bool>(false,bVar1);
  return;
}

Assistant:

void test(S source)
{
	assertEquals(    3, source.Min());
	assertEquals(   10, source.Max());
	assertEquals(    8, source.Count());
	assertEquals(   52, source.Sum());
	assertEquals(    3, source.Take(3).Min());
	assertEquals(    5, source.Take(3).Max());
	assertEquals(    6, source.Skip(3).Min());
	assertEquals(   10, source.Skip(3).Max());
	assertEquals(    3, source.TakeWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.TakeWhile([](int x){ return x < 5; }).Max());
	assertEquals(    5, source.SkipWhile([](int x){ return x < 5; }).Min());
	assertEquals(    4, source.Where([](int x){ return x < 7; }).Count());
	assertEquals(    6, source.Where([](int x){ return x % 3 == 0; }).Skip(1).First());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Count());
	assertEquals(    6, source.GroupBy([](int x){ return x < 5; }).First().Count());
	assertEquals(    2, source.GroupBy([](int x){ return x < 5; }).Last().Count());
	assertEquals(    5, source.Single([](int x){ return x == 5; }));
	assertEquals(    5, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Min());
	assertEquals(    7, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Max());
	assertEquals(    3, Adapt(std::vector<int>{1,5,6,7,5}).Intersect(source).Count());
	assertEquals(    3, source.Intersect(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    5, source.Except(Adapt(std::vector<int>{1,5,6,7,5})).Count());
	assertEquals(    3, source.Except(IEnumerable<int>::Range(5,9)).Count());
	assertEquals(    8, source.Intersect(source).Count());
	assertEquals(    0, source.Except(source).Count());
	assertEquals( true, source.Any());
	assertEquals( true, source.All());
	assertEquals( true, source.Any([](int x) { return x > 9; }));
	assertEquals(false, source.All([](int x) { return x > 9; }));
	assertEquals(false, source.Any([](int x) { return x > 10; }));
	assertEquals( true, source.All([](int x) { return x <= 10; }));
	assertEquals( true, source.Contains(6));
	assertEquals(false, source.Contains(16));
}